

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *this_00;
  vector<crnlib::vec<6U,_float>_> *this_01;
  hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
  *this_02;
  uint *puVar1;
  vec<6U,_float> *pvVar2;
  raw_node *prVar3;
  double dVar4;
  uint new_hash_size;
  undefined8 uVar5;
  hash_map_type *phVar6;
  bool bVar7;
  uint i_2;
  uint32 uVar8;
  vq_node *pvVar9;
  long lVar10;
  executable_task *pObj;
  value_type *pvVar11;
  uint uVar12;
  vq_node *pvVar13;
  vec<6U,_float> *pvVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 in_register_00000084;
  undefined7 in_register_00000089;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  node_queue;
  vq_node root;
  uint local_110;
  uint local_10c;
  insert_result local_108;
  elemental_vector *local_e8;
  uint local_dc;
  undefined1 local_d8 [8];
  value_type vStack_d0;
  value_type local_c8;
  float local_c0 [4];
  ulong local_b0;
  node_vec_type *local_a8;
  undefined4 local_9c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong uStack_60;
  float local_58;
  undefined4 local_54;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined2 local_40;
  undefined1 local_3e;
  
  local_b0 = CONCAT44(in_register_00000084,max_splits);
  local_9c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  this_00 = &this->m_vectorsInfo;
  uVar23 = (this->m_vectorsInfo).m_size;
  if (uVar23 != size) {
    if ((uVar23 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,size,uVar23 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  this_01 = &this->m_weightedVectors;
  uVar23 = (this->m_weightedVectors).m_size;
  if (uVar23 != size) {
    if ((uVar23 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_01,size,uVar23 + 1 == size,0x18,(object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  uVar23 = (this->m_weightedDotProducts).m_size;
  if (uVar23 != size) {
    if (uVar23 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_weightedDotProducts,size,uVar23 + 1 == size,8,
                   (object_mover)0x0,false);
      }
      uVar23 = (this->m_weightedDotProducts).m_size;
      memset((this->m_weightedDotProducts).m_p + uVar23,0,(ulong)(size - uVar23) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar23 = (this->m_vectorsInfoLeft).m_size;
  if (uVar23 != size) {
    if ((uVar23 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar23 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar23 = (this->m_vectorsInfoRight).m_size;
  if (uVar23 != size) {
    if ((uVar23 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar23 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar23 = (this->m_vectorComparison).m_size;
  if (uVar23 != size) {
    if (uVar23 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar23 + 1 == size,1,
                   (object_mover)0x0,false);
      }
      uVar23 = (this->m_vectorComparison).m_size;
      memset((this->m_vectorComparison).m_p + uVar23,0,(ulong)(size - uVar23));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_a8 = &this->m_nodes;
  local_e8._0_4_ = (int)local_b0 * 4;
  uVar23 = (this->m_nodes).m_size;
  if (uVar23 != (uint)local_e8) {
    if (uVar23 <= (uint)local_e8) {
      if ((this->m_nodes).m_capacity < (uint)local_e8) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_a8,(uint)local_e8,uVar23 + 1 == (uint)local_e8,0x40,
                   vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover,
                   false);
      }
      uVar23 = (this->m_nodes).m_size;
      uVar12 = (uint)local_e8 - uVar23;
      if (uVar12 != 0) {
        pvVar9 = (this->m_nodes).m_p + uVar23;
        pvVar13 = pvVar9 + uVar12;
        do {
          (pvVar9->m_centroid).m_s[4] = 0.0;
          (pvVar9->m_centroid).m_s[5] = 0.0;
          pvVar9->m_total_weight = 0;
          (pvVar9->m_centroid).m_s[0] = 0.0;
          (pvVar9->m_centroid).m_s[1] = 0.0;
          (pvVar9->m_centroid).m_s[2] = 0.0;
          (pvVar9->m_centroid).m_s[3] = 0.0;
          pvVar9->m_left = -1;
          pvVar9->m_right = -1;
          pvVar9->m_codebook_index = -1;
          pvVar9->m_unsplittable = false;
          pvVar9->m_alternative = false;
          pvVar9->m_processed = false;
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar13);
      }
    }
    (this->m_nodes).m_size = (uint)local_e8;
  }
  local_e8 = (elemental_vector *)&this->m_codebook;
  pvVar14 = (this->m_codebook).m_p;
  if (pvVar14 != (vec<6U,_float> *)0x0) {
    crnlib_free(pvVar14);
    local_e8->m_p = (vec<6U,_float> *)0x0;
    *(undefined8 *)&local_e8->m_size = 0;
  }
  uVar18 = local_b0;
  if (pTask_pool == (task_pool *)0x0) {
    local_110 = 1;
  }
  else {
    local_110 = pTask_pool->m_num_threads + 1;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  local_40 = 0;
  local_3e = 0;
  local_54 = 0;
  if ((this->m_vectorsInfo).m_size == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar10 = 0;
    uVar15 = 0;
    pvVar14 = vectors;
    do {
      this_00->m_p[uVar15].index = (uint)uVar15;
      uVar23 = weights[uVar15];
      this_00->m_p[uVar15].weight = uVar23;
      fVar25 = (float)uVar23;
      lVar20 = 0;
      do {
        *(float *)((long)&local_98.c.
                          super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4) =
             pvVar14->m_s[lVar20] * fVar25;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      pvVar2 = this_01->m_p;
      *(pointer *)(pvVar2[uVar15].m_s + 4) =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar2 = pvVar2 + uVar15;
      *(pointer *)pvVar2->m_s =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(pvVar2->m_s + 2) =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pvVar2 = this_01->m_p;
      lVar20 = 0;
      do {
        *(float *)((long)&local_78 + lVar20 * 4) =
             *(float *)((long)pvVar2->m_s + lVar20 * 4 + lVar10) +
             *(float *)((long)&local_78 + lVar20 * 4);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      uStack_60 = uStack_60 + uVar23;
      fVar26 = vectors[uVar15].m_s[0] * vectors[uVar15].m_s[0];
      lVar20 = 1;
      do {
        fVar26 = fVar26 + pvVar14->m_s[lVar20] * pvVar14->m_s[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      (this->m_weightedDotProducts).m_p[uVar15] = (double)(fVar26 * fVar25);
      dVar4 = dVar4 + (this->m_weightedDotProducts).m_p[uVar15];
      uVar15 = uVar15 + 1;
      pvVar14 = pvVar14 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar15 < (this->m_vectorsInfo).m_size);
  }
  fVar25 = (float)local_78 * (float)local_78;
  lVar10 = 1;
  do {
    fVar26 = *(float *)((long)&local_78 + lVar10 * 4);
    fVar25 = fVar25 + fVar26 * fVar26;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  uVar23 = (uint)local_b0;
  local_58 = (float)(dVar4 - (double)(fVar25 / (float)uStack_60));
  lVar10 = 0;
  do {
    *(float *)((long)&local_78 + lVar10 * 4) =
         *(float *)((long)&local_78 + lVar10 * 4) * (1.0 / (float)uStack_60);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10c = 0;
  pvVar9 = local_a8->m_p;
  *(undefined8 *)((pvVar9->m_centroid).m_s + 4) = local_68;
  *(undefined8 *)(pvVar9->m_centroid).m_s = local_78;
  *(undefined8 *)((pvVar9->m_centroid).m_s + 2) = uStack_70;
  *(undefined4 *)((long)&pvVar9->m_codebook_index + 3) = 0xff;
  pvVar9->m_end = size;
  pvVar9->m_left = 0xffffffff;
  pvVar9->m_right = -1;
  pvVar9->m_codebook_index = -1;
  pvVar9->m_total_weight = uStack_60;
  pvVar9->m_variance = (float)(int)(ulong)(uint)local_58;
  pvVar9->m_begin = (int)((ulong)(uint)local_58 >> 0x20);
  local_d8 = (undefined1  [8])((ulong)(uint)local_58 << 0x20);
  local_50 = size;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::push(&local_98,(value_type *)local_d8);
  local_10c = local_10c + 1;
  uVar16 = 1;
  uVar12 = uVar16;
  if (1 < local_110) {
    if (1 < uVar23) {
      do {
        uVar12 = uVar16;
        if (((long)local_98.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_110) ||
           (bVar7 = split_node(this,&local_98,&local_10c,pTask_pool), !bVar7)) break;
        uVar16 = uVar16 + 1;
        uVar12 = uVar23;
      } while (uVar23 != uVar16);
    }
    if ((long)local_98.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_110) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                *)local_d8,&local_98.c);
      local_dc = (uint)((uVar18 & 0xffffffff) / (ulong)local_110);
      local_108.first.m_pTable = (hash_map_type *)0x0;
      local_108.first.m_index = 0;
      local_108.first._12_4_ = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_108,local_110,false,0xc,(object_mover)0x0,false);
      local_108.first.m_index = local_110;
      if ((value_type)local_d8 != vStack_d0) {
        iVar22 = (int)local_b0 * 2;
        iVar17 = local_dc * 2;
        uVar23 = 0;
        do {
          phVar6 = local_108.first.m_pTable;
          uVar18 = (ulong)uVar23;
          *(undefined4 *)((long)&((local_108.first.m_pTable)->m_values).m_p + uVar18 * 0xc) =
               *(undefined4 *)local_d8;
          *(int *)((long)&((local_108.first.m_pTable)->m_values).m_p + uVar18 * 0xc + 4) = iVar22;
          (&((local_108.first.m_pTable)->m_values).m_size)[uVar18 * 3] = local_dc;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de990;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task
                    (pTask_pool,pObj,uVar18,(void *)((long)&(phVar6->m_values).m_p + uVar18 * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                 *)local_d8);
          iVar22 = iVar22 + iVar17;
          uVar23 = uVar23 + 1;
        } while ((value_type)local_d8 != vStack_d0);
      }
      task_pool::join(pTask_pool);
      uVar23 = (uint)local_b0;
      if (local_108.first.m_pTable != (hash_map_type *)0x0) {
        crnlib_free(local_108.first.m_pTable);
      }
      if ((value_type)local_d8 != (value_type)0x0) {
        operator_delete((void *)local_d8);
      }
    }
  }
  if (uVar12 < uVar23) {
    iVar17 = ~uVar12 + uVar23;
    do {
      bVar7 = split_node(this,&local_98,&local_10c,pTask_pool);
      bVar24 = iVar17 != 0;
      iVar17 = iVar17 + -1;
    } while (bVar7 && bVar24);
  }
  if (local_10c != 0) {
    this_02 = &this->m_node_index_map;
    uVar18 = 0;
    do {
      pvVar9 = local_a8->m_p;
      if ((pvVar9[uVar18].m_alternative != false) || (pvVar9[uVar18].m_left == -1)) {
        pvVar9 = pvVar9 + uVar18;
        pvVar9->m_codebook_index = (this->m_codebook).m_size;
        uVar23 = (this->m_codebook).m_size;
        if ((this->m_codebook).m_capacity <= uVar23) {
          elemental_vector::increase_capacity(local_e8,uVar23 + 1,true,0x18,(object_mover)0x0,false)
          ;
        }
        pvVar14 = (this->m_codebook).m_p;
        uVar23 = (this->m_codebook).m_size;
        *(undefined8 *)(pvVar14[uVar23].m_s + 4) = *(undefined8 *)((pvVar9->m_centroid).m_s + 4);
        uVar5 = *(undefined8 *)((pvVar9->m_centroid).m_s + 2);
        pvVar14 = pvVar14 + uVar23;
        *(undefined8 *)pvVar14->m_s = *(undefined8 *)(pvVar9->m_centroid).m_s;
        *(undefined8 *)(pvVar14->m_s + 2) = uVar5;
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        if (((char)local_9c != '\0') &&
           (uVar15 = (ulong)pvVar9->m_begin, pvVar9->m_begin < pvVar9->m_end)) {
          do {
            uVar23 = (this->m_vectorsInfo).m_p[uVar15].index;
            local_c0[0] = (float)pvVar9->m_codebook_index;
            pvVar11 = (value_type *)(this->m_vectors + uVar23);
            local_d8 = *(undefined1 (*) [8])pvVar11;
            vStack_d0 = pvVar11[1];
            local_c8 = *(value_type *)(this->m_vectors[uVar23].m_s + 4);
            local_108.first.m_pTable = (hash_map_type *)0x0;
            local_108.first._8_8_ = local_108.first._8_8_ & 0xffffffff00000000;
            local_108.second = false;
            if ((this->m_node_index_map).m_values.m_size == 0) {
LAB_0018a728:
              new_hash_size = (this->m_node_index_map).m_values.m_size * 2;
              if (new_hash_size < 5) {
                new_hash_size = 4;
              }
              hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
              ::rehash(this_02,new_hash_size);
              bVar7 = hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                      ::insert_no_grow(this_02,&local_108,(vec<6U,_float> *)local_d8,
                                       (uint *)local_c0);
              if (!bVar7) {
                crnlib_fail("\"insert() failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                            ,0x15d);
              }
            }
            else {
              uVar8 = fast_hash((vec<6U,_float> *)local_d8,0x18);
              uVar23 = uVar8 * -0x61c88647 >> ((byte)(this->m_node_index_map).m_hash_shift & 0x1f);
              prVar3 = (this->m_node_index_map).m_values.m_p;
              pvVar11 = (value_type *)(prVar3 + uVar23);
              if (prVar3[uVar23].m_bits[0x1c] == '\0') {
LAB_0018a6e0:
                if ((this->m_node_index_map).m_grow_threshold <=
                    (this->m_node_index_map).m_num_valid) goto LAB_0018a728;
                pvVar11[2] = local_c8;
                pvVar11->m_index = local_d8._0_4_;
                pvVar11->m_variance = (float)local_d8._4_4_;
                pvVar11[1] = vStack_d0;
                pvVar11[3].m_index = (uint)local_c0[0];
                *(undefined1 *)&pvVar11[3].m_variance = 1;
                puVar1 = &(this->m_node_index_map).m_num_valid;
                *puVar1 = *puVar1 + 1;
                local_108.second = true;
              }
              else {
                if (((float)pvVar11->m_index != (float)local_d8._0_4_) ||
                   (NAN((float)pvVar11->m_index) || NAN((float)local_d8._0_4_))) {
LAB_0018a65e:
                  uVar16 = (this->m_node_index_map).m_values.m_size - 1;
                  uVar12 = uVar23;
                  do {
                    do {
                      bVar7 = uVar12 == 0;
                      pvVar11 = pvVar11 + -4;
                      uVar12 = uVar12 - 1;
                      if (bVar7) {
                        pvVar11 = (value_type *)(prVar3 + uVar16);
                        uVar12 = uVar16;
                      }
                      if (uVar23 == uVar12) {
                        bVar7 = false;
LAB_0018a6d7:
                        bVar24 = false;
                        goto LAB_0018a6d9;
                      }
                      bVar7 = *(char *)&pvVar11[3].m_variance == '\0';
                      if (bVar7) goto LAB_0018a6d7;
                    } while (((float)pvVar11->m_index != (float)local_d8._0_4_) ||
                            (NAN((float)pvVar11->m_index) || NAN((float)local_d8._0_4_)));
                    uVar19 = 0xffffffffffffffff;
                    while (uVar19 != 4) {
                      puVar1 = &pvVar11[1].m_index + uVar19;
                      uVar21 = uVar19 + 1;
                      lVar10 = uVar19 - 4;
                      if (((float)*puVar1 != local_c0[lVar10]) ||
                         (uVar19 = uVar21, NAN((float)*puVar1) || NAN(local_c0[lVar10])))
                      goto LAB_0018a6c4;
                    }
                    uVar21 = 5;
LAB_0018a6c4:
                  } while (uVar21 < 5);
                  local_108.first.m_index = uVar12;
                  local_108.second = false;
                  bVar24 = true;
                  bVar7 = false;
                  local_108.first.m_pTable = this_02;
LAB_0018a6d9:
                  uVar23 = uVar12;
                  if (bVar7) goto LAB_0018a6e0;
                  if (!bVar24) goto LAB_0018a728;
                  goto LAB_0018a772;
                }
                uVar19 = 0xffffffffffffffff;
                while (uVar19 != 4) {
                  lVar10 = uVar19 * 4;
                  uVar21 = uVar19 + 1;
                  lVar20 = uVar19 - 4;
                  if ((*(float *)(prVar3[uVar23].m_bits + lVar10 + 8) != local_c0[lVar20]) ||
                     (uVar19 = uVar21,
                     NAN(*(float *)(prVar3[uVar23].m_bits + lVar10 + 8)) || NAN(local_c0[lVar20])))
                  goto LAB_0018a651;
                }
                uVar21 = 5;
LAB_0018a651:
                if (uVar21 < 5) goto LAB_0018a65e;
                local_108.second = false;
              }
              local_108.first.m_index = uVar23;
              local_108.first.m_pTable = this_02;
            }
LAB_0018a772:
            uVar15 = uVar15 + 1;
          } while (uVar15 < pvVar9->m_end);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < local_10c);
  }
  if (local_98.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }